

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

uint crnlib::dxt1_block::get_block_colors3(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  color_quad<unsigned_char,_int> *in_RDI;
  color_quad_u8 c1;
  color_quad_u8 c0;
  uint in_stack_00000018;
  bool in_stack_0000001d;
  uint16 in_stack_0000001e;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_14;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_10 [2];
  color_quad<unsigned_char,_int> *local_8;
  
  local_8 = in_RDI;
  unpack_color(in_stack_0000001e,in_stack_0000001d,in_stack_00000018);
  unpack_color(in_stack_0000001e,in_stack_0000001d,in_stack_00000018);
  color_quad<unsigned_char,_int>::operator=
            (local_8,(color_quad<unsigned_char,_int> *)&local_10[0].field_0);
  color_quad<unsigned_char,_int>::operator=
            (local_8 + 1,(color_quad<unsigned_char,_int> *)&local_14.field_0);
  color_quad<unsigned_char,_int>::set_noclamp_rgba
            (local_8 + 2,(int)((uint)(byte)local_10[0]._0_1_ + (uint)local_14.field_0.r) >> 1,
             (int)((uint)(byte)local_10[0]._1_1_ + (uint)local_14.field_0.g) >> 1,
             (int)((uint)(byte)local_10[0]._2_1_ + (uint)local_14.field_0.b) >> 1,0xff);
  color_quad<unsigned_char,_int>::set_noclamp_rgba(local_8 + 3,0,0,0,0);
  return 3;
}

Assistant:

uint dxt1_block::get_block_colors3(color_quad_u8* pDst, uint16 color0, uint16 color1) {
  color_quad_u8 c0(unpack_color(color0, true));
  color_quad_u8 c1(unpack_color(color1, true));

  pDst[0] = c0;
  pDst[1] = c1;
  pDst[2].set_noclamp_rgba((c0.r + c1.r) >> 1U, (c0.g + c1.g) >> 1U, (c0.b + c1.b) >> 1U, 255U);
  pDst[3].set_noclamp_rgba(0, 0, 0, 0);

  return 3;
}